

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.hpp
# Opt level: O0

IMove __thiscall
generic_bots::
FixedMctsBot<uttt::IBoard,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_(*)(const_uttt::IBoard_&,_long_long)>
::MakeMove(FixedMctsBot<uttt::IBoard,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_(*)(const_uttt::IBoard_&,_long_long)>
           *this)

{
  bool bVar1;
  reference pMVar2;
  __normal_iterator<mcts::MCTSResults_*,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>
  *in_RDI;
  double dVar3;
  double v;
  MCTSResults *result;
  iterator __end0;
  iterator __begin0;
  vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> *__range2;
  IMove move;
  double max;
  vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> results;
  vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> *in_stack_ffffffffffffff88;
  IMove *in_stack_ffffffffffffff98;
  IBoard *in_stack_ffffffffffffffa0;
  __normal_iterator<mcts::MCTSResults_*,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>
  local_40;
  undefined1 *local_38;
  IMove local_30;
  double local_28;
  undefined1 local_20 [32];
  
  (*(code *)in_RDI[2]._M_current)(local_20,in_RDI[1]._M_current,in_RDI[3]._M_current);
  local_28 = -1.1;
  local_30 = -1;
  local_38 = local_20;
  local_40._M_current =
       (MCTSResults *)
       std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>::begin
                 (in_stack_ffffffffffffff88);
  std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>::end(in_stack_ffffffffffffff88)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<mcts::MCTSResults_*,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>
                               *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    pMVar2 = __gnu_cxx::
             __normal_iterator<mcts::MCTSResults_*,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>
             ::operator*(&local_40);
    dVar3 = pMVar2->value / (double)pMVar2->total;
    if (local_28 < dVar3) {
      local_30 = pMVar2->move;
      local_28 = dVar3;
    }
    __gnu_cxx::
    __normal_iterator<mcts::MCTSResults_*,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>
    ::operator++(&local_40);
  }
  uttt::IBoard::ApplyMove(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>::~vector
            ((vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> *)
             in_stack_ffffffffffffffa0);
  return local_30;
}

Assistant:

game::IMove
FixedMctsBot<IGame, MCTS>::MakeMove()
{
    auto results = mcts(*this->game, num_iterations);

    double max = -1.1;
    game::IMove move = -1;
    for (const auto &result : results)
    {
        auto v = result.value / result.total;
        if (v > max)
            max = v, move = result.move;
    }

    this->game->ApplyMove(move);

    return move;
}